

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O3

string * __thiscall
polyscope::SurfaceOneFormTangentVectorQuantity::niceName_abi_cxx11_
          (string *__return_storage_ptr__,SurfaceOneFormTangentVectorQuantity *this)

{
  long lVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar1 = *(long *)&(this->super_SurfaceVectorQuantity).field_0x148;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar1,
             *(long *)&(this->super_SurfaceVectorQuantity).field_0x150 + lVar1);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string SurfaceOneFormTangentVectorQuantity::niceName() { return name + " (1-form tangent vector)"; }